

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int EncodeData(BrotliEncoderState *s,int is_last,int force_flush,size_t *out_size,uint8_t **output)

{
  ushort uVar1;
  HasherHandle puVar2;
  int iVar3;
  int iVar4;
  BrotliEncoderState *params;
  int iVar5;
  uint uVar6;
  uint32_t uVar7;
  size_t sVar8;
  uint32_t *puVar9;
  uint8_t *puVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  int local_11e0;
  int local_11dc;
  size_t local_11c0;
  ulong local_11b0;
  ulong local_11a0;
  HasherCommon *local_1180;
  int local_1170;
  int local_116c;
  int local_1168;
  bool local_1161;
  void *local_1160;
  ulong local_1150;
  size_t storage_ix_1;
  uint8_t *storage_1;
  uint local_1138;
  uint32_t metablock_size;
  int should_flush;
  int next_input_fits_metablock;
  size_t processed_bytes;
  size_t max_commands;
  size_t max_literals;
  size_t max_length;
  Command_conflict *new_commands;
  size_t newsize;
  int *table;
  size_t table_size;
  size_t storage_ix;
  uint8_t *storage;
  MemoryManager *pMStack_10d8;
  ContextType literal_context_mode;
  MemoryManager *m;
  uint8_t *puStack_10c8;
  uint32_t mask;
  uint8_t *data;
  uint32_t wrapped_last_processed_pos;
  uint32_t bytes;
  uint64_t delta;
  uint8_t **output_local;
  size_t *out_size_local;
  int force_flush_local;
  int is_last_local;
  BrotliEncoderState *s_local;
  HasherHandle local_1088;
  HasherHandle self;
  ulong local_1078;
  ulong local_1070;
  BrotliEncoderState *local_1068;
  H10 *local_1060;
  uint8_t *local_1058;
  HasherHandle *local_1050;
  MemoryManager *local_1048;
  ulong local_1040;
  size_t max_backward;
  size_t i;
  size_t i_end;
  size_t i_start;
  H10 *self_17;
  uint8_t *local_1010;
  ulong local_1008;
  ulong local_1000;
  HasherHandle local_ff8;
  ulong local_ff0;
  ulong local_fe8;
  ulong local_fe0;
  undefined8 local_fd8;
  ulong local_fd0;
  Command_conflict *local_fc8;
  size_t local_fc0;
  size_t alloc_size;
  HasherCommon *pHStack_fb0;
  int one_shot;
  HasherCommon *common;
  HasherHandle self_1;
  ulong local_f98;
  ulong local_f90;
  uint8_t *local_f88;
  BrotliEncoderState *local_f80;
  HasherHandle *local_f78;
  MemoryManager *local_f70;
  HasherCommon *local_f68;
  HasherCommon *local_f60;
  HasherHandle local_f58;
  H10 *local_f50;
  uint8_t *local_f48;
  ulong local_f40;
  ulong local_f38;
  HasherHandle local_f30;
  H10 *local_f28;
  uint8_t *local_f20;
  ulong local_f18;
  ulong local_f10;
  HasherHandle local_f08;
  H10 *local_f00;
  uint8_t *local_ef8;
  ulong local_ef0;
  ulong local_ee8;
  HasherHandle local_ee0;
  H10 *local_ed8;
  uint8_t *local_ed0;
  ulong local_ec8;
  ulong local_ec0;
  HasherHandle local_eb8;
  H10 *local_eb0;
  uint8_t *local_ea8;
  ulong local_ea0;
  ulong local_e98;
  HasherHandle local_e90;
  H10 *local_e88;
  uint8_t *local_e80;
  ulong local_e78;
  ulong local_e70;
  HasherHandle local_e68;
  H10 *local_e60;
  uint8_t *local_e58;
  ulong local_e50;
  ulong local_e48;
  HasherHandle local_e40;
  H10 *local_e38;
  uint8_t *local_e30;
  ulong local_e28;
  ulong local_e20;
  HasherHandle local_e18;
  H10 *local_e10;
  uint8_t *local_e08;
  ulong local_e00;
  ulong local_df8;
  HasherHandle local_df0;
  BrotliHasherParams *local_de8;
  BrotliEncoderState *local_de0;
  size_t local_dd8;
  size_t result;
  uint local_dc4;
  BrotliEncoderState *local_dc0;
  HasherHandle local_db8;
  HasherHandle local_db0;
  ulong local_d88;
  uint local_d7c;
  BrotliEncoderState *local_d78;
  ulong local_d70;
  uint local_d64;
  BrotliEncoderState *local_d60;
  ulong local_d58;
  uint local_d4c;
  BrotliEncoderState *local_d48;
  long local_d40;
  size_t block_size;
  size_t bucket_size;
  uint local_d24;
  BrotliEncoderState *local_d20;
  long local_d18;
  size_t block_size_1;
  size_t bucket_size_1;
  uint local_cfc;
  BrotliEncoderState *local_cf8;
  ulong local_cf0;
  uint local_ce4;
  BrotliEncoderState *local_ce0;
  ulong local_cd8;
  uint local_ccc;
  BrotliEncoderState *local_cc8;
  ulong local_cc0;
  uint local_cb4;
  BrotliEncoderState *local_cb0;
  ulong local_ca8;
  uint local_c9c;
  BrotliEncoderState *local_c98;
  ulong local_c90;
  size_t num_nodes;
  uint local_c7c;
  BrotliEncoderState *local_c78;
  HasherHandle local_c70;
  HasherHandle local_c68;
  undefined4 local_c60;
  uint32_t local_c5c;
  uint32_t off_2;
  uint32_t key_2;
  H10 *local_c50;
  uint8_t *local_c48;
  HasherHandle local_c40;
  HasherHandle local_c38;
  HasherHandle local_c30;
  undefined4 local_c28;
  uint32_t local_c24;
  uint32_t off_1;
  uint32_t key_1;
  H10 *local_c18;
  uint8_t *local_c10;
  HasherHandle local_c08;
  HasherHandle local_c00;
  HasherHandle local_bf8;
  undefined4 local_bf0;
  uint32_t local_bec;
  uint32_t off;
  uint32_t key;
  H10 *local_be0;
  uint8_t *local_bd8;
  HasherHandle local_bd0;
  HasherHandle local_bc8;
  HasherHandle local_bc0;
  uint local_bb8;
  uint32_t local_bb4;
  uint32_t off_5;
  uint32_t key_5;
  H10 *local_ba8;
  uint8_t *local_ba0;
  HasherHandle local_b98;
  HasherHandle local_b90;
  HasherHandle local_b88;
  uint local_b80;
  uint32_t local_b7c;
  uint32_t off_4;
  uint32_t key_4;
  H10 *local_b70;
  uint8_t *local_b68;
  HasherHandle local_b60;
  HasherHandle local_b58;
  HasherHandle local_b50;
  uint local_b48;
  uint32_t local_b44;
  uint32_t off_3;
  uint32_t key_3;
  H10 *local_b38;
  uint8_t *local_b30;
  HasherHandle local_b28;
  HasherHandle local_b20;
  HasherHandle local_b18;
  uint local_b10;
  uint32_t local_b0c;
  uint32_t off_8;
  uint32_t key_8;
  H10 *local_b00;
  uint8_t *local_af8;
  HasherHandle local_af0;
  HasherHandle local_ae8;
  HasherHandle local_ae0;
  uint local_ad8;
  uint32_t local_ad4;
  uint32_t off_7;
  uint32_t key_7;
  H10 *local_ac8;
  uint8_t *local_ac0;
  HasherHandle local_ab8;
  HasherHandle local_ab0;
  HasherHandle local_aa8;
  uint local_aa0;
  uint32_t local_a9c;
  uint32_t off_6;
  uint32_t key_6;
  H10 *local_a90;
  uint8_t *local_a88;
  HasherHandle local_a80;
  HasherHandle local_a78;
  HasherHandle local_a70;
  long local_a68;
  size_t offset_2;
  size_t minor_ix_2;
  HasherHandle puStack_a50;
  uint32_t key_11;
  uint16_t *num_2;
  H5 *self_4;
  H10 *local_a38;
  uint8_t *local_a30;
  HasherHandle local_a28;
  HasherHandle local_a20;
  HasherHandle local_a18;
  HasherHandle local_a10;
  uint16_t *local_a08;
  long local_a00;
  size_t offset_1;
  size_t minor_ix_1;
  HasherHandle puStack_9e8;
  uint32_t key_10;
  uint16_t *num_1;
  H5 *self_3;
  H10 *local_9d0;
  uint8_t *local_9c8;
  HasherHandle local_9c0;
  HasherHandle local_9b8;
  HasherHandle local_9b0;
  HasherHandle local_9a8;
  uint16_t *local_9a0;
  long local_998;
  size_t offset;
  size_t minor_ix;
  HasherHandle puStack_980;
  uint32_t key_9;
  uint16_t *num;
  H5 *self_2;
  H10 *local_968;
  uint8_t *local_960;
  HasherHandle local_958;
  HasherHandle local_950;
  HasherHandle local_948;
  HasherHandle local_940;
  uint16_t *local_938;
  uint16_t *local_930;
  uint16_t *local_928;
  uint16_t *local_920;
  uint16_t *local_918;
  uint16_t *local_910;
  uint16_t *local_908;
  long local_900;
  size_t offset_5;
  size_t minor_ix_5;
  HasherHandle puStack_8e8;
  uint32_t key_14;
  uint16_t *num_5;
  H6 *self_7;
  H10 *local_8d0;
  uint8_t *local_8c8;
  HasherHandle local_8c0;
  HasherHandle local_8b8;
  HasherHandle local_8b0;
  HasherHandle local_8a8;
  uint16_t *local_8a0;
  ulong local_898;
  uint64_t h_2;
  ulong local_888;
  ulong *local_880;
  ulong *local_878;
  long local_870;
  size_t offset_4;
  size_t minor_ix_4;
  HasherHandle puStack_858;
  uint32_t key_13;
  uint16_t *num_4;
  H6 *self_6;
  H10 *local_840;
  uint8_t *local_838;
  HasherHandle local_830;
  HasherHandle local_828;
  HasherHandle local_820;
  HasherHandle local_818;
  uint16_t *local_810;
  ulong local_808;
  uint64_t h_1;
  ulong local_7f8;
  ulong *local_7f0;
  ulong *local_7e8;
  long local_7e0;
  size_t offset_3;
  size_t minor_ix_3;
  HasherHandle puStack_7c8;
  uint32_t key_12;
  uint16_t *num_3;
  H6 *self_5;
  H10 *local_7b0;
  uint8_t *local_7a8;
  HasherHandle local_7a0;
  HasherHandle local_798;
  HasherHandle local_790;
  HasherHandle local_788;
  uint16_t *local_780;
  ulong local_778;
  uint64_t h;
  ulong local_768;
  ulong *local_760;
  ulong *local_758;
  uint16_t *local_750;
  uint16_t *local_748;
  uint16_t *local_740;
  uint16_t *local_738;
  uint16_t *local_730;
  uint16_t *local_728;
  ulong local_720;
  size_t delta_3;
  size_t idx_2;
  size_t bank_2;
  size_t key_17;
  H40 *self_10;
  H10 *local_6f0;
  uint8_t *local_6e8;
  HasherHandle local_6e0;
  HasherHandle local_6d8;
  HasherHandle local_6d0;
  uint local_6c4;
  int *piStack_6c0;
  uint32_t h_5;
  int *local_6b8;
  ulong local_6b0;
  size_t delta_2;
  size_t idx_1;
  size_t bank_1;
  size_t key_16;
  H40 *self_9;
  H10 *local_680;
  uint8_t *local_678;
  HasherHandle local_670;
  HasherHandle local_668;
  HasherHandle local_660;
  uint local_654;
  int *piStack_650;
  uint32_t h_4;
  int *local_648;
  ulong local_640;
  size_t delta_1;
  size_t idx;
  size_t bank;
  size_t key_15;
  H40 *self_8;
  H10 *local_610;
  uint8_t *local_608;
  HasherHandle local_600;
  HasherHandle local_5f8;
  HasherHandle local_5f0;
  uint local_5e4;
  int *piStack_5e0;
  uint32_t h_3;
  int *local_5d8;
  ulong local_5d0;
  size_t delta_6;
  size_t idx_5;
  size_t bank_5;
  size_t key_20;
  H41 *self_13;
  H10 *local_5a0;
  uint8_t *local_598;
  HasherHandle local_590;
  HasherHandle local_588;
  HasherHandle local_580;
  uint local_574;
  int *piStack_570;
  uint32_t h_8;
  int *local_568;
  ulong local_560;
  size_t delta_5;
  size_t idx_4;
  size_t bank_4;
  size_t key_19;
  H41 *self_12;
  H10 *local_530;
  uint8_t *local_528;
  HasherHandle local_520;
  HasherHandle local_518;
  HasherHandle local_510;
  uint local_504;
  int *piStack_500;
  uint32_t h_7;
  int *local_4f8;
  ulong local_4f0;
  size_t delta_4;
  size_t idx_3;
  size_t bank_3;
  size_t key_18;
  H41 *self_11;
  H10 *local_4c0;
  uint8_t *local_4b8;
  HasherHandle local_4b0;
  HasherHandle local_4a8;
  HasherHandle local_4a0;
  uint local_494;
  int *piStack_490;
  uint32_t h_6;
  int *local_488;
  ulong local_480;
  size_t delta_9;
  size_t idx_8;
  size_t bank_8;
  size_t key_23;
  H42 *self_16;
  H10 *local_450;
  uint8_t *local_448;
  HasherHandle local_440;
  HasherHandle local_438;
  HasherHandle local_430;
  uint local_424;
  int *piStack_420;
  uint32_t h_11;
  int *local_418;
  ulong local_410;
  size_t delta_8;
  size_t idx_7;
  size_t bank_7;
  size_t key_22;
  H42 *self_15;
  H10 *local_3e0;
  uint8_t *local_3d8;
  HasherHandle local_3d0;
  HasherHandle local_3c8;
  HasherHandle local_3c0;
  uint local_3b4;
  int *piStack_3b0;
  uint32_t h_10;
  int *local_3a8;
  ulong local_3a0;
  size_t delta_7;
  size_t idx_6;
  size_t bank_6;
  size_t key_21;
  H42 *self_14;
  H10 *local_370;
  uint8_t *local_368;
  HasherHandle local_360;
  HasherHandle local_358;
  HasherHandle local_350;
  uint local_344;
  int *piStack_340;
  uint32_t h_9;
  int *local_338;
  uint local_330;
  uint32_t local_32c;
  uint32_t off_11;
  uint32_t key_26;
  H10 *local_320;
  uint8_t *local_318;
  HasherHandle local_310;
  HasherHandle local_308;
  HasherHandle local_300;
  uint local_2f8;
  uint32_t local_2f4;
  uint32_t off_10;
  uint32_t key_25;
  H10 *local_2e8;
  uint8_t *local_2e0;
  HasherHandle local_2d8;
  HasherHandle local_2d0;
  HasherHandle local_2c8;
  uint local_2c0;
  uint32_t local_2bc;
  uint32_t off_9;
  uint32_t key_24;
  H10 *local_2b0;
  uint8_t *local_2a8;
  HasherHandle local_2a0;
  HasherHandle local_298;
  HasherHandle local_290;
  ulong local_288;
  size_t len;
  size_t cur_len;
  size_t prev_ix_masked;
  size_t backward;
  size_t depth_remaining;
  size_t best_len_right;
  size_t best_len_left;
  size_t node_right;
  size_t node_left;
  size_t prev_ix;
  uint32_t *forest;
  uint32_t key_27;
  int should_reroot_tree;
  size_t max_comp_len;
  size_t cur_ix_masked;
  ulong *local_210;
  ulong local_208;
  long local_200;
  H10 *local_1f8;
  size_t local_1f0;
  uint8_t *local_1e8;
  ulong *local_1e0;
  size_t local_1d8;
  size_t local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  ulong *local_1b8;
  size_t local_1b0;
  ulong *local_1a8;
  size_t local_1a0;
  ulong *local_198;
  ulong local_190;
  ulong *local_188;
  size_t local_180;
  ulong *local_178;
  size_t local_170;
  ulong *local_168;
  ulong local_160;
  ulong *local_158;
  ulong local_150;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched;
  ulong *local_128;
  uint8_t *local_120;
  size_t local_118;
  ulong *local_110;
  ulong *local_108;
  ulong *local_100;
  ulong *local_f8;
  ulong local_f0;
  ulong local_e8;
  size_t local_e0;
  undefined2 local_d4;
  ushort local_d2;
  uint16_t copycode;
  uint16_t *puStack_d0;
  uint16_t inscode;
  undefined4 local_c4;
  undefined8 local_c0;
  ulong local_b8;
  int local_ac;
  ulong uStack_a8;
  uint32_t nbits;
  ushort local_9e;
  undefined8 uStack_98;
  uint32_t nbits_1;
  undefined2 local_8e;
  int local_8c;
  ushort local_86;
  int offset_6;
  uint16_t bits64;
  ushort local_7c;
  ushort local_7a;
  long local_68;
  long local_60;
  int local_54;
  BrotliEncoderState *pBStack_50;
  int bits;
  undefined4 local_48;
  int local_44;
  BrotliEncoderState *local_40;
  int local_38;
  int local_34;
  
  delta = (uint64_t)output;
  output_local = (uint8_t **)out_size;
  out_size_local._0_4_ = force_flush;
  out_size_local._4_4_ = is_last;
  _force_flush_local = s;
  _wrapped_last_processed_pos = UnprocessedInputSize(s);
  data._4_4_ = (uint)_wrapped_last_processed_pos;
  data._0_4_ = WrapPosition(_force_flush_local->last_processed_pos_);
  pMStack_10d8 = &_force_flush_local->memory_manager_;
  iVar5 = EnsureInitialized(_force_flush_local);
  uVar11 = _wrapped_last_processed_pos;
  if (iVar5 == 0) {
    s_local._4_4_ = 0;
  }
  else {
    puStack_10c8 = (_force_flush_local->ringbuffer_).buffer_;
    m._4_4_ = (_force_flush_local->ringbuffer_).mask_;
    if (_force_flush_local->is_last_block_emitted_ == 0) {
      if (out_size_local._4_4_ != 0) {
        _force_flush_local->is_last_block_emitted_ = 1;
      }
      sVar8 = InputBlockSize(_force_flush_local);
      if (sVar8 < uVar11) {
        s_local._4_4_ = 0;
      }
      else {
        if (((_force_flush_local->params).quality == 1) &&
           (_force_flush_local->command_buf_ == (uint32_t *)0x0)) {
          puVar9 = (uint32_t *)BrotliAllocate(pMStack_10d8,0x80000);
          _force_flush_local->command_buf_ = puVar9;
          puVar10 = (uint8_t *)BrotliAllocate(pMStack_10d8,0x20000);
          _force_flush_local->literal_buf_ = puVar10;
        }
        if (((_force_flush_local->params).quality == 0) ||
           ((_force_flush_local->params).quality == 1)) {
          table_size = (size_t)_force_flush_local->last_bytes_bits_;
          if ((_wrapped_last_processed_pos == 0) && (out_size_local._4_4_ == 0)) {
            *output_local = (uint8_t *)0x0;
            s_local._4_4_ = 1;
          }
          else {
            storage_ix = (size_t)GetBrotliStorage(_force_flush_local,(ulong)(data._4_4_ * 2 + 0x1f7)
                                                 );
            *(uint8_t *)storage_ix = (uint8_t)_force_flush_local->last_bytes_;
            *(uint8_t *)(storage_ix + 1) = (uint8_t)(_force_flush_local->last_bytes_ >> 8);
            newsize = (size_t)GetHashTable(_force_flush_local,(_force_flush_local->params).quality,
                                           (ulong)data._4_4_,(size_t *)&table);
            if ((_force_flush_local->params).quality == 0) {
              BrotliCompressFragmentFast
                        (pMStack_10d8,puStack_10c8 + ((uint32_t)data & m._4_4_),(ulong)data._4_4_,
                         out_size_local._4_4_,(int *)newsize,(size_t)table,
                         _force_flush_local->cmd_depths_,_force_flush_local->cmd_bits_,
                         &_force_flush_local->cmd_code_numbits_,_force_flush_local->cmd_code_,
                         &table_size,(uint8_t *)storage_ix);
            }
            else {
              BrotliCompressFragmentTwoPass
                        (pMStack_10d8,puStack_10c8 + ((uint32_t)data & m._4_4_),(ulong)data._4_4_,
                         out_size_local._4_4_,_force_flush_local->command_buf_,
                         _force_flush_local->literal_buf_,(int *)newsize,(size_t)table,&table_size,
                         (uint8_t *)storage_ix);
            }
            _force_flush_local->last_bytes_ = (ushort)*(byte *)(storage_ix + (table_size >> 3));
            _force_flush_local->last_bytes_bits_ = (byte)table_size & 7;
            UpdateLastProcessedPos(_force_flush_local);
            *(size_t *)delta = storage_ix;
            *output_local = (uint8_t *)(table_size >> 3);
            s_local._4_4_ = 1;
          }
        }
        else {
          new_commands = (Command_conflict *)
                         (_force_flush_local->num_commands_ + (ulong)(data._4_4_ >> 1) + 1);
          if ((Command_conflict *)_force_flush_local->cmd_alloc_size_ < new_commands) {
            new_commands = (Command_conflict *)
                           ((long)&new_commands->insert_len_ + (ulong)((data._4_4_ >> 2) + 0x10));
            _force_flush_local->cmd_alloc_size_ = (size_t)new_commands;
            if (new_commands == (Command_conflict *)0x0) {
              local_1160 = (void *)0x0;
            }
            else {
              local_1160 = BrotliAllocate(pMStack_10d8,(long)new_commands * 0x10);
            }
            max_length = (size_t)local_1160;
            if (_force_flush_local->commands_ != (Command_conflict *)0x0) {
              memcpy(local_1160,_force_flush_local->commands_,_force_flush_local->num_commands_ << 4
                    );
              BrotliFree(pMStack_10d8,_force_flush_local->commands_);
              _force_flush_local->commands_ = (Command_conflict *)0x0;
            }
            _force_flush_local->commands_ = (Command_conflict *)max_length;
          }
          local_1050 = &_force_flush_local->hasher_;
          local_1060 = (H10 *)(ulong)m._4_4_;
          local_1070 = (ulong)(uint32_t)data;
          local_1078 = (ulong)data._4_4_;
          local_1048 = pMStack_10d8;
          local_1058 = puStack_10c8;
          local_1068 = _force_flush_local;
          self._4_4_ = out_size_local._4_4_;
          local_f70 = pMStack_10d8;
          local_f80 = _force_flush_local;
          local_f88 = puStack_10c8;
          self_1._4_4_ = out_size_local._4_4_;
          common = (HasherCommon *)0x0;
          pHStack_fb0 = (HasherCommon *)0x0;
          local_1161 = local_1070 == 0 && out_size_local._4_4_ != 0;
          alloc_size._4_4_ = (uint)local_1161;
          local_f98 = local_1078;
          local_f90 = local_1070;
          local_f78 = local_1050;
          if (*local_1050 == (HasherHandle)0x0) {
            local_de8 = &(_force_flush_local->params).hasher;
            local_de0 = _force_flush_local;
            if ((_force_flush_local->params).quality < 10) {
              if (((_force_flush_local->params).quality == 4) &&
                 (0xfffff < (_force_flush_local->params).size_hint)) {
                local_de8->type = 0x36;
              }
              else if ((_force_flush_local->params).quality < 5) {
                local_de8->type = (_force_flush_local->params).quality;
              }
              else if ((_force_flush_local->params).lgwin < 0x11) {
                if ((_force_flush_local->params).quality < 7) {
                  local_1168 = 0x28;
                }
                else {
                  local_1168 = 0x2a;
                  if ((_force_flush_local->params).quality < 9) {
                    local_1168 = 0x29;
                  }
                }
                local_de8->type = local_1168;
              }
              else if (((_force_flush_local->params).size_hint < 0x100000) ||
                      ((_force_flush_local->params).lgwin < 0x13)) {
                local_de8->type = 5;
                (_force_flush_local->params).hasher.block_bits =
                     (_force_flush_local->params).quality + -1;
                iVar5 = 0xf;
                if ((_force_flush_local->params).quality < 7) {
                  iVar5 = 0xe;
                }
                (_force_flush_local->params).hasher.bucket_bits = iVar5;
                if ((_force_flush_local->params).quality < 7) {
                  local_1170 = 4;
                }
                else {
                  local_1170 = 0x10;
                  if ((_force_flush_local->params).quality < 9) {
                    local_1170 = 10;
                  }
                }
                (_force_flush_local->params).hasher.num_last_distances_to_check = local_1170;
              }
              else {
                local_de8->type = 6;
                (_force_flush_local->params).hasher.block_bits =
                     (_force_flush_local->params).quality + -1;
                (_force_flush_local->params).hasher.bucket_bits = 0xf;
                (_force_flush_local->params).hasher.hash_len = 5;
                if ((_force_flush_local->params).quality < 7) {
                  local_116c = 4;
                }
                else {
                  local_116c = 0x10;
                  if ((_force_flush_local->params).quality < 9) {
                    local_116c = 10;
                  }
                }
                (_force_flush_local->params).hasher.num_last_distances_to_check = local_116c;
              }
            }
            else {
              local_de8->type = 10;
            }
            local_dc0 = _force_flush_local;
            local_dd8 = 0x28;
            switch((_force_flush_local->params).hasher.type) {
            case 2:
              local_d78 = _force_flush_local;
              local_dd8 = 0x4002c;
              local_d88 = local_1078;
              local_d7c = alloc_size._4_4_;
              break;
            case 3:
              local_d60 = _force_flush_local;
              local_dd8 = 0x40030;
              local_d70 = local_1078;
              local_d64 = alloc_size._4_4_;
              break;
            case 4:
              local_d48 = _force_flush_local;
              local_dd8 = 0x80038;
              local_d58 = local_1078;
              local_d4c = alloc_size._4_4_;
              break;
            case 5:
              local_d20 = _force_flush_local;
              block_size = 1L << ((byte)(_force_flush_local->params).hasher.bucket_bits & 0x3f);
              local_d40 = 1L << ((byte)(_force_flush_local->params).hasher.block_bits & 0x3f);
              local_dd8 = block_size * (local_d40 * 4 + 2) + 0x40;
              bucket_size = local_1078;
              local_d24 = alloc_size._4_4_;
              break;
            case 6:
              local_cf8 = _force_flush_local;
              block_size_1 = 1L << ((byte)(_force_flush_local->params).hasher.bucket_bits & 0x3f);
              local_d18 = 1L << ((byte)(_force_flush_local->params).hasher.block_bits & 0x3f);
              local_dd8 = block_size_1 * (local_d18 * 4 + 2) + 0x50;
              bucket_size_1 = local_1078;
              local_cfc = alloc_size._4_4_;
              break;
            default:
              break;
            case 10:
              local_c78 = _force_flush_local;
              local_c90 = 1L << ((byte)(_force_flush_local->params).lgwin & 0x3f);
              if ((alloc_size._4_4_ != 0) && (local_1078 < local_c90)) {
                local_c90 = local_1078;
              }
              local_dd8 = local_c90 * 8 + 0x80038;
              num_nodes = local_1078;
              local_c7c = alloc_size._4_4_;
              break;
            case 0x28:
              local_ce0 = _force_flush_local;
              local_dd8 = 0x80038;
              local_cf0 = local_1078;
              local_ce4 = alloc_size._4_4_;
              break;
            case 0x29:
              local_cc8 = _force_flush_local;
              local_dd8 = 0x80038;
              local_cd8 = local_1078;
              local_ccc = alloc_size._4_4_;
              break;
            case 0x2a:
              local_cb0 = _force_flush_local;
              local_dd8 = 0x140430;
              local_cc0 = local_1078;
              local_cb4 = alloc_size._4_4_;
              break;
            case 0x36:
              local_c98 = _force_flush_local;
              local_dd8 = 0x400038;
              local_ca8 = local_1078;
              local_c9c = alloc_size._4_4_;
            }
            local_fc0 = local_dd8;
            result = local_1078;
            local_dc4 = alloc_size._4_4_;
            if (local_dd8 == 0) {
              local_1180 = (HasherCommon *)0x0;
            }
            else {
              local_1180 = (HasherCommon *)BrotliAllocate(pMStack_10d8,local_dd8);
            }
            common = local_1180;
            *local_f78 = (HasherHandle)local_1180;
            local_f68 = local_1180;
            pHStack_fb0 = local_1180;
            (local_1180->params).num_last_distances_to_check =
                 (local_f80->params).hasher.num_last_distances_to_check;
            iVar5 = (local_f80->params).hasher.bucket_bits;
            iVar3 = (local_f80->params).hasher.block_bits;
            iVar4 = (local_f80->params).hasher.hash_len;
            (local_1180->params).type = (local_f80->params).hasher.type;
            (local_1180->params).bucket_bits = iVar5;
            (local_1180->params).block_bits = iVar3;
            (local_1180->params).hash_len = iVar4;
            switch((local_1180->params).type) {
            case 2:
              InitializeH2(*local_f78,&local_f80->params);
              break;
            case 3:
              InitializeH3(*local_f78,&local_f80->params);
              break;
            case 4:
              InitializeH4(*local_f78,&local_f80->params);
              break;
            case 5:
              InitializeH5(*local_f78,&local_f80->params);
              break;
            case 6:
              InitializeH6(*local_f78,&local_f80->params);
              break;
            default:
              break;
            case 10:
              InitializeH10(*local_f78,&local_f80->params);
              break;
            case 0x28:
              InitializeH40(*local_f78,&local_f80->params);
              break;
            case 0x29:
              InitializeH41(*local_f78,&local_f80->params);
              break;
            case 0x2a:
              InitializeH42(*local_f78,&local_f80->params);
              break;
            case 0x36:
              InitializeH54(*local_f78,&local_f80->params);
            }
            local_db8 = *local_f78;
            if (local_db8 != (HasherHandle)0x0) {
              local_db8[0x14] = '\0';
              local_db8[0x15] = '\0';
              local_db8[0x16] = '\0';
              local_db8[0x17] = '\0';
              local_db0 = local_db8;
            }
          }
          pHStack_fb0 = (HasherCommon *)*local_f78;
          common = pHStack_fb0;
          local_f60 = pHStack_fb0;
          if (pHStack_fb0->is_prepared_ == 0) {
            switch((pHStack_fb0->params).type) {
            case 2:
              PrepareH2((HasherHandle)pHStack_fb0,alloc_size._4_4_,local_f98,local_f88);
              break;
            case 3:
              PrepareH3((HasherHandle)pHStack_fb0,alloc_size._4_4_,local_f98,local_f88);
              break;
            case 4:
              PrepareH4((HasherHandle)pHStack_fb0,alloc_size._4_4_,local_f98,local_f88);
              break;
            case 5:
              PrepareH5((HasherHandle)pHStack_fb0,alloc_size._4_4_,local_f98,local_f88);
              break;
            case 6:
              PrepareH6((HasherHandle)pHStack_fb0,alloc_size._4_4_,local_f98,local_f88);
              break;
            default:
              break;
            case 10:
              PrepareH10((HasherHandle)pHStack_fb0,alloc_size._4_4_,local_f98,local_f88);
              break;
            case 0x28:
              PrepareH40((HasherHandle)pHStack_fb0,alloc_size._4_4_,local_f98,local_f88);
              break;
            case 0x29:
              PrepareH41((HasherHandle)pHStack_fb0,alloc_size._4_4_,local_f98,local_f88);
              break;
            case 0x2a:
              PrepareH42((HasherHandle)pHStack_fb0,alloc_size._4_4_,local_f98,local_f88);
              break;
            case 0x36:
              PrepareH54((HasherHandle)pHStack_fb0,alloc_size._4_4_,local_f98,local_f88);
            }
            if (local_f90 == 0) {
              pHStack_fb0->dict_num_lookups = 0;
              pHStack_fb0->dict_num_matches = 0;
            }
            pHStack_fb0->is_prepared_ = 1;
          }
          local_1088 = *local_1050;
          local_f58 = local_1088;
          switch(*(undefined4 *)local_1088) {
          case 2:
            local_f38 = local_1078;
            local_f40 = local_1070;
            local_f48 = local_1058;
            local_f50 = local_1060;
            local_f30 = local_1088;
            if ((6 < local_1078) && (2 < local_1070)) {
              _off = local_1070 - 3;
              local_bd8 = local_1058;
              local_be0 = local_1060;
              local_bd0 = local_1088;
              local_bec = HashBytesH2(local_1058 + (_off & (ulong)local_1060));
              local_bf0 = 0;
              local_bc8 = local_bd0;
              local_bc0 = local_bd0;
              *(int *)(local_bd0 + (ulong)local_bec * 4 + 0x28) = (int)_off;
              _off_1 = local_f40 - 2;
              local_c08 = local_f30;
              local_c10 = local_f48;
              local_c18 = local_f50;
              local_c24 = HashBytesH2(local_f48 + (_off_1 & (ulong)local_f50));
              local_c28 = 0;
              local_c00 = local_c08;
              local_bf8 = local_c08;
              *(int *)(local_c08 + (ulong)local_c24 * 4 + 0x28) = (int)_off_1;
              _off_2 = local_f40 - 1;
              local_c40 = local_f30;
              local_c48 = local_f48;
              local_c50 = local_f50;
              local_c5c = HashBytesH2(local_f48 + (_off_2 & (ulong)local_f50));
              local_c60 = 0;
              local_c38 = local_c40;
              local_c30 = local_c40;
              *(int *)(local_c40 + (ulong)local_c5c * 4 + 0x28) = (int)_off_2;
            }
            break;
          case 3:
            local_f10 = local_1078;
            local_f18 = local_1070;
            local_f20 = local_1058;
            local_f28 = local_1060;
            local_f08 = local_1088;
            if ((6 < local_1078) && (2 < local_1070)) {
              _off_3 = local_1070 - 3;
              local_b30 = local_1058;
              local_b38 = local_1060;
              local_b28 = local_1088;
              local_b44 = HashBytesH3(local_1058 + (_off_3 & (ulong)local_1060));
              local_b48 = (uint)(_off_3 >> 3) & 1;
              local_b20 = local_b28;
              local_b18 = local_b28;
              *(int *)(local_b28 + (ulong)(local_b44 + local_b48) * 4 + 0x28) = (int)_off_3;
              _off_4 = local_f18 - 2;
              local_b60 = local_f08;
              local_b68 = local_f20;
              local_b70 = local_f28;
              local_b7c = HashBytesH3(local_f20 + (_off_4 & (ulong)local_f28));
              local_b80 = (uint)(_off_4 >> 3) & 1;
              local_b58 = local_b60;
              local_b50 = local_b60;
              *(int *)(local_b60 + (ulong)(local_b7c + local_b80) * 4 + 0x28) = (int)_off_4;
              _off_5 = local_f18 - 1;
              local_b98 = local_f08;
              local_ba0 = local_f20;
              local_ba8 = local_f28;
              local_bb4 = HashBytesH3(local_f20 + (_off_5 & (ulong)local_f28));
              local_bb8 = (uint)(_off_5 >> 3) & 1;
              local_b90 = local_b98;
              local_b88 = local_b98;
              *(int *)(local_b98 + (ulong)(local_bb4 + local_bb8) * 4 + 0x28) = (int)_off_5;
            }
            break;
          case 4:
            local_ee8 = local_1078;
            local_ef0 = local_1070;
            local_ef8 = local_1058;
            local_f00 = local_1060;
            local_ee0 = local_1088;
            if ((6 < local_1078) && (2 < local_1070)) {
              _off_6 = local_1070 - 3;
              local_a88 = local_1058;
              local_a90 = local_1060;
              local_a80 = local_1088;
              local_a9c = HashBytesH4(local_1058 + (_off_6 & (ulong)local_1060));
              local_aa0 = (uint)(_off_6 >> 3) & 3;
              local_a78 = local_a80;
              local_a70 = local_a80;
              *(int *)(local_a80 + (ulong)(local_a9c + local_aa0) * 4 + 0x28) = (int)_off_6;
              _off_7 = local_ef0 - 2;
              local_ab8 = local_ee0;
              local_ac0 = local_ef8;
              local_ac8 = local_f00;
              local_ad4 = HashBytesH4(local_ef8 + (_off_7 & (ulong)local_f00));
              local_ad8 = (uint)(_off_7 >> 3) & 3;
              local_ab0 = local_ab8;
              local_aa8 = local_ab8;
              *(int *)(local_ab8 + (ulong)(local_ad4 + local_ad8) * 4 + 0x28) = (int)_off_7;
              _off_8 = local_ef0 - 1;
              local_af0 = local_ee0;
              local_af8 = local_ef8;
              local_b00 = local_f00;
              local_b0c = HashBytesH4(local_ef8 + (_off_8 & (ulong)local_f00));
              local_b10 = (uint)(_off_8 >> 3) & 3;
              local_ae8 = local_af0;
              local_ae0 = local_af0;
              *(int *)(local_af0 + (ulong)(local_b0c + local_b10) * 4 + 0x28) = (int)_off_8;
            }
            break;
          case 5:
            local_ec0 = local_1078;
            local_ec8 = local_1070;
            local_ed0 = local_1058;
            local_ed8 = local_1060;
            local_eb8 = local_1088;
            if ((2 < local_1078) && (2 < local_1070)) {
              self_2 = (H5 *)(local_1070 - 3);
              local_960 = local_1058;
              local_968 = local_1060;
              num = (uint16_t *)(local_1088 + 0x28);
              puStack_980 = local_1088 + 0x40;
              local_958 = local_1088;
              local_948 = local_1088;
              local_940 = local_1088;
              local_938 = num;
              minor_ix._4_4_ =
                   HashBytesH5(local_1058 + ((ulong)self_2 & (ulong)local_1060),
                               *(int *)(local_1088 + 0x38));
              offset = (size_t)((uint)*(ushort *)(puStack_980 + (ulong)minor_ix._4_4_ * 2) &
                               *(uint *)(num + 10));
              local_950 = local_958;
              local_998 = offset + (minor_ix._4_4_ << ((byte)*(undefined4 *)(local_958 + 8) & 0x1f))
              ;
              local_930 = num;
              local_928 = num;
              *(int *)(num + *(long *)num + local_998 * 2 + 0xc) = (int)self_2;
              *(short *)(puStack_980 + (ulong)minor_ix._4_4_ * 2) =
                   *(short *)(puStack_980 + (ulong)minor_ix._4_4_ * 2) + 1;
              self_3 = (H5 *)(local_ec8 - 2);
              local_9c0 = local_eb8;
              local_9c8 = local_ed0;
              local_9d0 = local_ed8;
              local_9b0 = local_eb8;
              local_9a8 = local_eb8;
              num_1 = (uint16_t *)(local_eb8 + 0x28);
              puStack_9e8 = local_eb8 + 0x40;
              local_9a0 = num_1;
              minor_ix_1._4_4_ =
                   HashBytesH5(local_ed0 + ((ulong)self_3 & (ulong)local_ed8),
                               *(int *)(local_eb8 + 0x38));
              offset_1 = (size_t)((uint)*(ushort *)(puStack_9e8 + (ulong)minor_ix_1._4_4_ * 2) &
                                 *(uint *)(num_1 + 10));
              local_9b8 = local_9c0;
              local_a00 = offset_1 +
                          (minor_ix_1._4_4_ << ((byte)*(undefined4 *)(local_9c0 + 8) & 0x1f));
              local_920 = num_1;
              local_918 = num_1;
              *(int *)(num_1 + *(long *)num_1 + local_a00 * 2 + 0xc) = (int)self_3;
              *(short *)(puStack_9e8 + (ulong)minor_ix_1._4_4_ * 2) =
                   *(short *)(puStack_9e8 + (ulong)minor_ix_1._4_4_ * 2) + 1;
              self_4 = (H5 *)(local_ec8 - 1);
              local_a28 = local_eb8;
              local_a30 = local_ed0;
              local_a38 = local_ed8;
              local_a18 = local_eb8;
              local_a10 = local_eb8;
              num_2 = (uint16_t *)(local_eb8 + 0x28);
              puStack_a50 = local_eb8 + 0x40;
              local_a08 = num_2;
              minor_ix_2._4_4_ =
                   HashBytesH5(local_ed0 + ((ulong)self_4 & (ulong)local_ed8),
                               *(int *)(local_eb8 + 0x38));
              offset_2 = (size_t)((uint)*(ushort *)(puStack_a50 + (ulong)minor_ix_2._4_4_ * 2) &
                                 *(uint *)(num_2 + 10));
              local_a20 = local_a28;
              local_a68 = offset_2 +
                          (minor_ix_2._4_4_ << ((byte)*(undefined4 *)(local_a28 + 8) & 0x1f));
              local_910 = num_2;
              local_908 = num_2;
              *(int *)(num_2 + *(long *)num_2 + local_a68 * 2 + 0xc) = (int)self_4;
              *(short *)(puStack_a50 + (ulong)minor_ix_2._4_4_ * 2) =
                   *(short *)(puStack_a50 + (ulong)minor_ix_2._4_4_ * 2) + 1;
            }
            break;
          case 6:
            local_e98 = local_1078;
            local_ea0 = local_1070;
            local_ea8 = local_1058;
            local_eb0 = local_1060;
            local_e90 = local_1088;
            if ((6 < local_1078) && (2 < local_1070)) {
              self_5 = (H6 *)(local_1070 - 3);
              local_7a8 = local_1058;
              local_7b0 = local_1060;
              num_3 = (uint16_t *)(local_1088 + 0x28);
              puStack_7c8 = local_1088 + 0x50;
              local_760 = (ulong *)(local_1058 + ((ulong)self_5 & (ulong)local_1060));
              local_768 = *(ulong *)(local_1088 + 0x40);
              h._4_4_ = *(undefined4 *)(local_1088 + 0x38);
              local_778 = (*local_760 & local_768) * 0x1fe35a7bd3579bd3;
              uVar11 = local_778 >> ((byte)h._4_4_ & 0x3f);
              minor_ix_3._4_4_ = (int)uVar11;
              offset_3 = (size_t)((uint)*(ushort *)(puStack_7c8 + (uVar11 & 0xffffffff) * 2) &
                                 *(uint *)(local_1088 + 0x48));
              local_7e0 = offset_3 +
                          (uint)(minor_ix_3._4_4_ << ((byte)*(undefined4 *)(local_1088 + 8) & 0x1f))
              ;
              *(int *)(local_1088 + local_7e0 * 4 + *(long *)num_3 * 2 + 0x50) = (int)self_5;
              *(short *)(puStack_7c8 + (uVar11 & 0xffffffff) * 2) =
                   *(short *)(puStack_7c8 + (uVar11 & 0xffffffff) * 2) + 1;
              self_6 = (H6 *)(local_1070 - 2);
              local_838 = local_1058;
              local_840 = local_1060;
              num_4 = (uint16_t *)(local_1088 + 0x28);
              puStack_858 = local_1088 + 0x50;
              local_7f0 = (ulong *)(local_1058 + ((ulong)self_6 & (ulong)local_1060));
              local_7f8 = *(ulong *)(local_1088 + 0x40);
              h_1._4_4_ = *(undefined4 *)(local_1088 + 0x38);
              local_808 = (*local_7f0 & local_7f8) * 0x1fe35a7bd3579bd3;
              uVar11 = local_808 >> ((byte)h_1._4_4_ & 0x3f);
              minor_ix_4._4_4_ = (int)uVar11;
              offset_4 = (size_t)((uint)*(ushort *)(puStack_858 + (uVar11 & 0xffffffff) * 2) &
                                 *(uint *)(local_1088 + 0x48));
              local_870 = offset_4 +
                          (uint)(minor_ix_4._4_4_ << ((byte)*(undefined4 *)(local_1088 + 8) & 0x1f))
              ;
              *(int *)(local_1088 + local_870 * 4 + *(long *)num_4 * 2 + 0x50) = (int)self_6;
              *(short *)(puStack_858 + (uVar11 & 0xffffffff) * 2) =
                   *(short *)(puStack_858 + (uVar11 & 0xffffffff) * 2) + 1;
              self_7 = (H6 *)(local_1070 - 1);
              local_8c8 = local_1058;
              local_8d0 = local_1060;
              num_5 = (uint16_t *)(local_1088 + 0x28);
              puStack_8e8 = local_1088 + 0x50;
              local_880 = (ulong *)(local_1058 + ((ulong)self_7 & (ulong)local_1060));
              local_888 = *(ulong *)(local_1088 + 0x40);
              h_2._4_4_ = *(undefined4 *)(local_1088 + 0x38);
              local_898 = (*local_880 & local_888) * 0x1fe35a7bd3579bd3;
              uVar11 = local_898 >> ((byte)h_2._4_4_ & 0x3f);
              minor_ix_5._4_4_ = (int)uVar11;
              offset_5 = (size_t)((uint)*(ushort *)(puStack_8e8 + (uVar11 & 0xffffffff) * 2) &
                                 *(uint *)(local_1088 + 0x48));
              local_900 = offset_5 +
                          (uint)(minor_ix_5._4_4_ << ((byte)*(undefined4 *)(local_1088 + 8) & 0x1f))
              ;
              *(int *)(local_1088 + local_900 * 4 + *(long *)num_5 * 2 + 0x50) = (int)self_7;
              *(short *)(puStack_8e8 + (uVar11 & 0xffffffff) * 2) =
                   *(short *)(puStack_8e8 + (uVar11 & 0xffffffff) * 2) + 1;
              local_8c0 = local_1088;
              local_8b8 = local_1088;
              local_8b0 = local_1088;
              local_8a8 = local_1088;
              local_8a0 = num_5;
              local_878 = local_880;
              local_830 = local_1088;
              local_828 = local_1088;
              local_820 = local_1088;
              local_818 = local_1088;
              local_810 = num_4;
              local_7e8 = local_7f0;
              local_7a0 = local_1088;
              local_798 = local_1088;
              local_790 = local_1088;
              local_788 = local_1088;
              local_780 = num_3;
              local_758 = local_760;
              local_750 = num_3;
              local_748 = num_3;
              local_740 = num_4;
              local_738 = num_4;
              local_730 = num_5;
              local_728 = num_5;
            }
            break;
          default:
            break;
          case 10:
            local_1000 = local_1078;
            local_1008 = local_1070;
            local_1010 = local_1058;
            self_17 = local_1060;
            i_start = (size_t)(local_1088 + 0x28);
            local_ff8 = local_1088;
            local_c70 = local_1088;
            local_c68 = local_1088;
            if ((2 < local_1078) && (0x7f < local_1070)) {
              max_backward = local_1070 - 0x7f;
              local_ff0 = max_backward + local_1078;
              local_fe8 = local_1070;
              local_11a0 = local_ff0;
              if (local_1070 < local_ff0) {
                local_11a0 = local_1070;
              }
              i = local_11a0;
              i_end = max_backward;
              for (; max_backward < i; max_backward = max_backward + 1) {
                local_fe0 = local_1008 - max_backward;
                local_fd8 = 0xf;
                local_11b0 = local_fe0;
                if (local_fe0 < 0xf) {
                  local_11b0 = 0xf;
                }
                local_1040 = *(long *)i_start - local_11b0;
                local_1e0 = (ulong *)i_start;
                local_1e8 = local_1010;
                local_1f0 = max_backward;
                local_1f8 = self_17;
                local_200 = 0x80;
                local_210 = (ulong *)0x0;
                cur_ix_masked = 0;
                max_comp_len = max_backward & (ulong)self_17;
                local_1c0 = 0x80;
                local_1c8 = 0x80;
                _key_27 = 0x80;
                forest._4_4_ = 1;
                local_208 = local_1040;
                forest._0_4_ = HashBytesH10(local_1010 + max_comp_len);
                local_1b8 = local_1e0;
                prev_ix = (size_t)(local_1e0 + 0x10002);
                uVar6 = *(uint *)((long)local_1e0 + (ulong)(uint32_t)forest * 4 + 8);
                local_188 = local_1e0;
                local_190 = local_1f0;
                node_right = (local_1f0 & *local_1e0) << 1;
                local_158 = local_1e0;
                local_160 = local_1f0;
                best_len_left = (local_1f0 & *local_1e0) * 2 + 1;
                best_len_right = 0;
                depth_remaining = 0;
                if (forest._4_4_ != 0) {
                  *(int *)((long)local_1e0 + (ulong)(uint32_t)forest * 4 + 8) = (int)local_1f0;
                }
                backward = 0x40;
                while( true ) {
                  node_left = (size_t)uVar6;
                  prev_ix_masked = local_1f0 - node_left;
                  cur_len = node_left & (ulong)local_1f8;
                  if (((prev_ix_masked == 0) || (local_208 < prev_ix_masked)) || (backward == 0))
                  break;
                  local_1d0 = best_len_right;
                  local_1d8 = depth_remaining;
                  if (best_len_right < depth_remaining) {
                    local_11c0 = best_len_right;
                  }
                  else {
                    local_11c0 = depth_remaining;
                  }
                  len = local_11c0;
                  local_120 = local_1e8 + max_comp_len + local_11c0;
                  local_128 = (ulong *)(local_1e8 + cur_len + local_11c0);
                  matched = local_200 - local_11c0;
                  limit2 = 0;
                  x = (matched >> 3) + 1;
LAB_00110d00:
                  x = x - 1;
                  if (x != 0) {
                    local_f8 = local_128;
                    local_100 = (ulong *)(local_120 + limit2);
                    if (*local_128 == *local_100) goto LAB_00110d62;
                    local_108 = local_128;
                    local_110 = (ulong *)(local_120 + limit2);
                    iVar5 = 0;
                    matching_bits = *local_128 ^ *local_110;
                    for (uVar11 = matching_bits; (uVar11 & 1) == 0;
                        uVar11 = uVar11 >> 1 | 0x8000000000000000) {
                      iVar5 = iVar5 + 1;
                    }
                    local_150 = (ulong)iVar5;
                    local_118 = (local_150 >> 3) + limit2;
                    goto LAB_00110ea3;
                  }
                  matched = (matched & 7) + 1;
                  while (matched = matched - 1, matched != 0) {
                    if (local_120[limit2] != (uint8_t)*local_128) {
                      local_118 = limit2;
                      goto LAB_00110ea3;
                    }
                    local_128 = (ulong *)((long)local_128 + 1);
                    limit2 = limit2 + 1;
                  }
                  local_118 = limit2;
LAB_00110ea3:
                  local_288 = local_11c0 + local_118;
                  if ((cur_ix_masked != 0) && (*local_210 < local_288)) {
                    *local_210 = local_288;
                    local_e0 = cur_ix_masked;
                    *(int *)cur_ix_masked = (int)prev_ix_masked;
                    *(int *)(cur_ix_masked + 4) = (int)local_288 * 0x20;
                    cur_ix_masked = cur_ix_masked + 8;
                    local_f0 = local_288;
                    local_e8 = prev_ix_masked;
                  }
                  limit2 = local_118;
                  if (_key_27 <= local_288) {
                    if (forest._4_4_ != 0) {
                      local_1a8 = local_1e0;
                      local_1b0 = node_left;
                      *(int *)(prev_ix + node_right * 4) =
                           (int)*(ulong *)(prev_ix + (node_left & *local_1e0) * 8);
                      local_178 = local_1e0;
                      local_180 = node_left;
                      *(undefined4 *)(prev_ix + best_len_left * 4) =
                           *(undefined4 *)((long)local_1e0 + (node_left & *local_1e0) * 8 + 0x80014)
                      ;
                    }
                    goto LAB_00111162;
                  }
                  if (local_1e8[cur_len + local_288] < local_1e8[max_comp_len + local_288]) {
                    if (forest._4_4_ != 0) {
                      *(uint *)(prev_ix + node_right * 4) = uVar6;
                    }
                    local_168 = local_1e0;
                    local_170 = node_left;
                    node_right = (node_left & *local_1e0) * 2 + 1;
                    uVar6 = *(uint *)(prev_ix + node_right * 4);
                    best_len_right = local_288;
                  }
                  else {
                    if (forest._4_4_ != 0) {
                      *(uint *)(prev_ix + best_len_left * 4) = uVar6;
                    }
                    local_198 = local_1e0;
                    local_1a0 = node_left;
                    best_len_left = (node_left & *local_1e0) * 2;
                    uVar6 = (uint)*(ulong *)(prev_ix + (node_left & *local_1e0) * 8);
                    depth_remaining = local_288;
                  }
                  backward = backward - 1;
                }
                if (forest._4_4_ != 0) {
                  *(int *)(prev_ix + node_right * 4) = (int)local_1e0[0x10001];
                  *(int *)(prev_ix + best_len_left * 4) = (int)local_1e0[0x10001];
                }
LAB_00111162:
              }
            }
            break;
          case 0x28:
            local_e70 = local_1078;
            local_e78 = local_1070;
            local_e80 = local_1058;
            local_e88 = local_1060;
            local_e68 = local_1088;
            if ((2 < local_1078) && (2 < local_1070)) {
              self_8 = (H40 *)(local_1070 - 3);
              local_608 = local_1058;
              local_610 = local_1060;
              key_15 = (size_t)(local_1088 + 0x28);
              piStack_5e0 = (int *)(local_1058 + ((ulong)self_8 & (ulong)local_1060));
              local_5e4 = *piStack_5e0 * 0x1e35a7bd;
              bank = (size_t)(local_5e4 >> 0x11);
              idx = 0;
              uVar1 = *(ushort *)(local_1088 + 0x80028);
              *(ushort *)(local_1088 + 0x80028) = uVar1 + 1;
              delta_1 = (size_t)(int)(uint)uVar1;
              local_640 = (long)self_8 - (ulong)*(uint *)(key_15 + bank * 4);
              local_1088[((ulong)self_8 & 0xffff) + 0x30028] = (uint8_t)(local_5e4 >> 0x11);
              if (0xffff < local_640) {
                local_640 = 0xffff;
              }
              *(short *)(local_1088 + delta_1 * 4 + 0x40028) = (short)local_640;
              *(undefined2 *)(local_1088 + delta_1 * 4 + 0x4002a) =
                   *(undefined2 *)(local_1088 + bank * 2 + 0x20028);
              *(int *)(key_15 + bank * 4) = (int)self_8;
              *(ushort *)(local_1088 + bank * 2 + 0x20028) = uVar1;
              self_9 = (H40 *)(local_1070 - 2);
              local_678 = local_1058;
              local_680 = local_1060;
              key_16 = (size_t)(local_1088 + 0x28);
              piStack_650 = (int *)(local_1058 + ((ulong)self_9 & (ulong)local_1060));
              local_654 = *piStack_650 * 0x1e35a7bd;
              bank_1 = (size_t)(local_654 >> 0x11);
              idx_1 = 0;
              uVar1 = *(ushort *)(local_1088 + 0x80028);
              *(ushort *)(local_1088 + 0x80028) = uVar1 + 1;
              delta_2 = (size_t)(int)(uint)uVar1;
              local_6b0 = (long)self_9 - (ulong)*(uint *)(key_16 + bank_1 * 4);
              local_1088[((ulong)self_9 & 0xffff) + 0x30028] = (uint8_t)(local_654 >> 0x11);
              if (0xffff < local_6b0) {
                local_6b0 = 0xffff;
              }
              *(short *)(local_1088 + delta_2 * 4 + 0x40028) = (short)local_6b0;
              *(undefined2 *)(local_1088 + delta_2 * 4 + 0x4002a) =
                   *(undefined2 *)(local_1088 + bank_1 * 2 + 0x20028);
              *(int *)(key_16 + bank_1 * 4) = (int)self_9;
              *(ushort *)(local_1088 + bank_1 * 2 + 0x20028) = uVar1;
              self_10 = (H40 *)(local_1070 - 1);
              local_6e8 = local_1058;
              local_6f0 = local_1060;
              key_17 = (size_t)(local_1088 + 0x28);
              piStack_6c0 = (int *)(local_1058 + ((ulong)self_10 & (ulong)local_1060));
              local_6c4 = *piStack_6c0 * 0x1e35a7bd;
              bank_2 = (size_t)(local_6c4 >> 0x11);
              idx_2 = 0;
              uVar1 = *(ushort *)(local_1088 + 0x80028);
              *(ushort *)(local_1088 + 0x80028) = uVar1 + 1;
              delta_3 = (size_t)(int)(uint)uVar1;
              local_720 = (long)self_10 - (ulong)*(uint *)(key_17 + bank_2 * 4);
              local_1088[((ulong)self_10 & 0xffff) + 0x30028] = (uint8_t)(local_6c4 >> 0x11);
              if (0xffff < local_720) {
                local_720 = 0xffff;
              }
              *(short *)(local_1088 + delta_3 * 4 + 0x40028) = (short)local_720;
              *(undefined2 *)(local_1088 + delta_3 * 4 + 0x4002a) =
                   *(undefined2 *)(local_1088 + bank_2 * 2 + 0x20028);
              *(int *)(key_17 + bank_2 * 4) = (int)self_10;
              *(ushort *)(local_1088 + bank_2 * 2 + 0x20028) = uVar1;
              local_6e0 = local_1088;
              local_6d8 = local_1088;
              local_6d0 = local_1088;
              local_6b8 = piStack_6c0;
              local_670 = local_1088;
              local_668 = local_1088;
              local_660 = local_1088;
              local_648 = piStack_650;
              local_600 = local_1088;
              local_5f8 = local_1088;
              local_5f0 = local_1088;
              local_5d8 = piStack_5e0;
            }
            break;
          case 0x29:
            local_e48 = local_1078;
            local_e50 = local_1070;
            local_e58 = local_1058;
            local_e60 = local_1060;
            local_e40 = local_1088;
            if ((2 < local_1078) && (2 < local_1070)) {
              self_11 = (H41 *)(local_1070 - 3);
              local_4b8 = local_1058;
              local_4c0 = local_1060;
              key_18 = (size_t)(local_1088 + 0x28);
              piStack_490 = (int *)(local_1058 + ((ulong)self_11 & (ulong)local_1060));
              local_494 = *piStack_490 * 0x1e35a7bd;
              bank_3 = (size_t)(local_494 >> 0x11);
              idx_3 = 0;
              uVar1 = *(ushort *)(local_1088 + 0x80028);
              *(ushort *)(local_1088 + 0x80028) = uVar1 + 1;
              delta_4 = (size_t)(int)(uint)uVar1;
              local_4f0 = (long)self_11 - (ulong)*(uint *)(key_18 + bank_3 * 4);
              local_1088[((ulong)self_11 & 0xffff) + 0x30028] = (uint8_t)(local_494 >> 0x11);
              if (0xffff < local_4f0) {
                local_4f0 = 0xffff;
              }
              *(short *)(local_1088 + delta_4 * 4 + 0x40028) = (short)local_4f0;
              *(undefined2 *)(local_1088 + delta_4 * 4 + 0x4002a) =
                   *(undefined2 *)(local_1088 + bank_3 * 2 + 0x20028);
              *(int *)(key_18 + bank_3 * 4) = (int)self_11;
              *(ushort *)(local_1088 + bank_3 * 2 + 0x20028) = uVar1;
              self_12 = (H41 *)(local_1070 - 2);
              local_528 = local_1058;
              local_530 = local_1060;
              key_19 = (size_t)(local_1088 + 0x28);
              piStack_500 = (int *)(local_1058 + ((ulong)self_12 & (ulong)local_1060));
              local_504 = *piStack_500 * 0x1e35a7bd;
              bank_4 = (size_t)(local_504 >> 0x11);
              idx_4 = 0;
              uVar1 = *(ushort *)(local_1088 + 0x80028);
              *(ushort *)(local_1088 + 0x80028) = uVar1 + 1;
              delta_5 = (size_t)(int)(uint)uVar1;
              local_560 = (long)self_12 - (ulong)*(uint *)(key_19 + bank_4 * 4);
              local_1088[((ulong)self_12 & 0xffff) + 0x30028] = (uint8_t)(local_504 >> 0x11);
              if (0xffff < local_560) {
                local_560 = 0xffff;
              }
              *(short *)(local_1088 + delta_5 * 4 + 0x40028) = (short)local_560;
              *(undefined2 *)(local_1088 + delta_5 * 4 + 0x4002a) =
                   *(undefined2 *)(local_1088 + bank_4 * 2 + 0x20028);
              *(int *)(key_19 + bank_4 * 4) = (int)self_12;
              *(ushort *)(local_1088 + bank_4 * 2 + 0x20028) = uVar1;
              self_13 = (H41 *)(local_1070 - 1);
              local_598 = local_1058;
              local_5a0 = local_1060;
              key_20 = (size_t)(local_1088 + 0x28);
              piStack_570 = (int *)(local_1058 + ((ulong)self_13 & (ulong)local_1060));
              local_574 = *piStack_570 * 0x1e35a7bd;
              bank_5 = (size_t)(local_574 >> 0x11);
              idx_5 = 0;
              uVar1 = *(ushort *)(local_1088 + 0x80028);
              *(ushort *)(local_1088 + 0x80028) = uVar1 + 1;
              delta_6 = (size_t)(int)(uint)uVar1;
              local_5d0 = (long)self_13 - (ulong)*(uint *)(key_20 + bank_5 * 4);
              local_1088[((ulong)self_13 & 0xffff) + 0x30028] = (uint8_t)(local_574 >> 0x11);
              if (0xffff < local_5d0) {
                local_5d0 = 0xffff;
              }
              *(short *)(local_1088 + delta_6 * 4 + 0x40028) = (short)local_5d0;
              *(undefined2 *)(local_1088 + delta_6 * 4 + 0x4002a) =
                   *(undefined2 *)(local_1088 + bank_5 * 2 + 0x20028);
              *(int *)(key_20 + bank_5 * 4) = (int)self_13;
              *(ushort *)(local_1088 + bank_5 * 2 + 0x20028) = uVar1;
              local_590 = local_1088;
              local_588 = local_1088;
              local_580 = local_1088;
              local_568 = piStack_570;
              local_520 = local_1088;
              local_518 = local_1088;
              local_510 = local_1088;
              local_4f8 = piStack_500;
              local_4b0 = local_1088;
              local_4a8 = local_1088;
              local_4a0 = local_1088;
              local_488 = piStack_490;
            }
            break;
          case 0x2a:
            local_e20 = local_1078;
            local_e28 = local_1070;
            local_e30 = local_1058;
            local_e38 = local_1060;
            local_e18 = local_1088;
            if ((2 < local_1078) && (2 < local_1070)) {
              self_14 = (H42 *)(local_1070 - 3);
              local_368 = local_1058;
              local_370 = local_1060;
              key_21 = (size_t)(local_1088 + 0x28);
              piStack_340 = (int *)(local_1058 + ((ulong)self_14 & (ulong)local_1060));
              local_344 = *piStack_340 * 0x1e35a7bd;
              bank_6 = (size_t)(local_344 >> 0x11);
              idx_6 = bank_6 & 0x1ff;
              uVar1 = *(ushort *)(local_1088 + idx_6 * 2 + 0x140028);
              *(ushort *)(local_1088 + idx_6 * 2 + 0x140028) = uVar1 + 1;
              uVar6 = uVar1 & 0x1ff;
              delta_7 = (size_t)(int)uVar6;
              local_3a0 = (long)self_14 - (ulong)*(uint *)(key_21 + bank_6 * 4);
              local_1088[((ulong)self_14 & 0xffff) + 0x30028] = (uint8_t)(local_344 >> 0x11);
              if (0xffff < local_3a0) {
                local_3a0 = 0xffff;
              }
              *(short *)(local_1088 + delta_7 * 4 + idx_6 * 0x800 + 0x40028) = (short)local_3a0;
              *(undefined2 *)(key_21 + delta_7 * 4 + idx_6 * 0x800 + 0x40002) =
                   *(undefined2 *)(local_1088 + bank_6 * 2 + 0x20028);
              *(int *)(key_21 + bank_6 * 4) = (int)self_14;
              *(short *)(local_1088 + bank_6 * 2 + 0x20028) = (short)uVar6;
              self_15 = (H42 *)(local_1070 - 2);
              local_3d8 = local_1058;
              local_3e0 = local_1060;
              key_22 = (size_t)(local_1088 + 0x28);
              piStack_3b0 = (int *)(local_1058 + ((ulong)self_15 & (ulong)local_1060));
              local_3b4 = *piStack_3b0 * 0x1e35a7bd;
              bank_7 = (size_t)(local_3b4 >> 0x11);
              idx_7 = bank_7 & 0x1ff;
              uVar1 = *(ushort *)(local_1088 + idx_7 * 2 + 0x140028);
              *(ushort *)(local_1088 + idx_7 * 2 + 0x140028) = uVar1 + 1;
              uVar6 = uVar1 & 0x1ff;
              delta_8 = (size_t)(int)uVar6;
              local_410 = (long)self_15 - (ulong)*(uint *)(key_22 + bank_7 * 4);
              local_1088[((ulong)self_15 & 0xffff) + 0x30028] = (uint8_t)(local_3b4 >> 0x11);
              if (0xffff < local_410) {
                local_410 = 0xffff;
              }
              *(short *)(local_1088 + delta_8 * 4 + idx_7 * 0x800 + 0x40028) = (short)local_410;
              *(undefined2 *)(key_22 + delta_8 * 4 + idx_7 * 0x800 + 0x40002) =
                   *(undefined2 *)(local_1088 + bank_7 * 2 + 0x20028);
              *(int *)(key_22 + bank_7 * 4) = (int)self_15;
              *(short *)(local_1088 + bank_7 * 2 + 0x20028) = (short)uVar6;
              self_16 = (H42 *)(local_1070 - 1);
              local_448 = local_1058;
              local_450 = local_1060;
              key_23 = (size_t)(local_1088 + 0x28);
              piStack_420 = (int *)(local_1058 + ((ulong)self_16 & (ulong)local_1060));
              local_424 = *piStack_420 * 0x1e35a7bd;
              bank_8 = (size_t)(local_424 >> 0x11);
              idx_8 = bank_8 & 0x1ff;
              uVar1 = *(ushort *)(local_1088 + idx_8 * 2 + 0x140028);
              *(ushort *)(local_1088 + idx_8 * 2 + 0x140028) = uVar1 + 1;
              uVar6 = uVar1 & 0x1ff;
              delta_9 = (size_t)(int)uVar6;
              local_480 = (long)self_16 - (ulong)*(uint *)(key_23 + bank_8 * 4);
              local_1088[((ulong)self_16 & 0xffff) + 0x30028] = (uint8_t)(local_424 >> 0x11);
              if (0xffff < local_480) {
                local_480 = 0xffff;
              }
              *(short *)(local_1088 + delta_9 * 4 + idx_8 * 0x800 + 0x40028) = (short)local_480;
              *(undefined2 *)(key_23 + delta_9 * 4 + idx_8 * 0x800 + 0x40002) =
                   *(undefined2 *)(local_1088 + bank_8 * 2 + 0x20028);
              *(int *)(key_23 + bank_8 * 4) = (int)self_16;
              *(short *)(local_1088 + bank_8 * 2 + 0x20028) = (short)uVar6;
              local_440 = local_1088;
              local_438 = local_1088;
              local_430 = local_1088;
              local_418 = piStack_420;
              local_3d0 = local_1088;
              local_3c8 = local_1088;
              local_3c0 = local_1088;
              local_3a8 = piStack_3b0;
              local_360 = local_1088;
              local_358 = local_1088;
              local_350 = local_1088;
              local_338 = piStack_340;
            }
            break;
          case 0x36:
            local_df8 = local_1078;
            local_e00 = local_1070;
            local_e08 = local_1058;
            local_e10 = local_1060;
            local_df0 = local_1088;
            if ((6 < local_1078) && (2 < local_1070)) {
              _off_9 = local_1070 - 3;
              local_2a8 = local_1058;
              local_2b0 = local_1060;
              local_2a0 = local_1088;
              local_2bc = HashBytesH54(local_1058 + (_off_9 & (ulong)local_1060));
              local_2c0 = (uint)(_off_9 >> 3) & 3;
              local_298 = local_2a0;
              local_290 = local_2a0;
              *(int *)(local_2a0 + (ulong)(local_2bc + local_2c0) * 4 + 0x28) = (int)_off_9;
              _off_10 = local_e00 - 2;
              local_2d8 = local_df0;
              local_2e0 = local_e08;
              local_2e8 = local_e10;
              local_2f4 = HashBytesH54(local_e08 + (_off_10 & (ulong)local_e10));
              local_2f8 = (uint)(_off_10 >> 3) & 3;
              local_2d0 = local_2d8;
              local_2c8 = local_2d8;
              *(int *)(local_2d8 + (ulong)(local_2f4 + local_2f8) * 4 + 0x28) = (int)_off_10;
              _off_11 = local_e00 - 1;
              local_310 = local_df0;
              local_318 = local_e08;
              local_320 = local_e10;
              local_32c = HashBytesH54(local_e08 + (_off_11 & (ulong)local_e10));
              local_330 = (uint)(_off_11 >> 3) & 3;
              local_308 = local_310;
              local_300 = local_310;
              *(int *)(local_310 + (ulong)(local_32c + local_330) * 4 + 0x28) = (int)_off_11;
            }
          }
          params = _force_flush_local;
          puVar10 = puStack_10c8;
          uVar7 = WrapPosition(_force_flush_local->last_flush_pos_);
          storage._4_4_ =
               ChooseContextMode(&params->params,puVar10,(ulong)uVar7,(ulong)m._4_4_,
                                 _force_flush_local->input_pos_ -
                                 _force_flush_local->last_flush_pos_);
          if ((_force_flush_local->num_commands_ != 0) &&
             (_force_flush_local->last_insert_len_ == 0)) {
            ExtendLastCommand(_force_flush_local,(uint32_t *)((long)&data + 4),(uint32_t *)&data);
          }
          if ((_force_flush_local->params).quality == 10) {
            BrotliCreateZopfliBackwardReferences
                      (pMStack_10d8,(ulong)data._4_4_,(ulong)(uint32_t)data,puStack_10c8,
                       (ulong)m._4_4_,&_force_flush_local->params,_force_flush_local->hasher_,
                       _force_flush_local->dist_cache_,&_force_flush_local->last_insert_len_,
                       _force_flush_local->commands_ + _force_flush_local->num_commands_,
                       &_force_flush_local->num_commands_,&_force_flush_local->num_literals_);
          }
          else if ((_force_flush_local->params).quality == 0xb) {
            BrotliCreateHqZopfliBackwardReferences
                      (pMStack_10d8,(ulong)data._4_4_,(ulong)(uint32_t)data,puStack_10c8,
                       (ulong)m._4_4_,&_force_flush_local->params,_force_flush_local->hasher_,
                       _force_flush_local->dist_cache_,&_force_flush_local->last_insert_len_,
                       _force_flush_local->commands_ + _force_flush_local->num_commands_,
                       &_force_flush_local->num_commands_,&_force_flush_local->num_literals_);
          }
          else {
            BrotliCreateBackwardReferences
                      ((ulong)data._4_4_,(ulong)(uint32_t)data,puStack_10c8,(ulong)m._4_4_,
                       &_force_flush_local->params,_force_flush_local->hasher_,
                       _force_flush_local->dist_cache_,&_force_flush_local->last_insert_len_,
                       _force_flush_local->commands_ + _force_flush_local->num_commands_,
                       &_force_flush_local->num_commands_,&_force_flush_local->num_literals_);
          }
          pBStack_50 = _force_flush_local;
          local_40 = _force_flush_local;
          local_34 = (_force_flush_local->params).lgwin;
          local_38 = (_force_flush_local->params).lgblock;
          local_11dc = local_38;
          if (local_38 < local_34) {
            local_11dc = local_34;
          }
          local_44 = local_11dc + 1;
          local_48 = 0x18;
          local_11e0 = local_44;
          if (0x17 < local_44) {
            local_11e0 = 0x18;
          }
          local_54 = local_11e0;
          max_literals = 1L << ((byte)local_11e0 & 0x3f);
          max_commands = max_literals >> 3;
          processed_bytes = max_literals >> 3;
          lVar12 = _force_flush_local->input_pos_ - _force_flush_local->last_flush_pos_;
          _should_flush = lVar12;
          sVar8 = InputBlockSize(_force_flush_local);
          metablock_size = (uint32_t)(lVar12 + sVar8 <= max_literals);
          bVar13 = false;
          if ((_force_flush_local->params).quality < 4) {
            bVar13 = 0x2ffe < _force_flush_local->num_literals_ + _force_flush_local->num_commands_;
          }
          local_1138 = (uint)bVar13;
          if (((((out_size_local._4_4_ == 0) && ((int)out_size_local == 0)) && (local_1138 == 0)) &&
              ((metablock_size != 0 && (_force_flush_local->num_literals_ < max_commands)))) &&
             (_force_flush_local->num_commands_ < processed_bytes)) {
            iVar5 = UpdateLastProcessedPos(_force_flush_local);
            if ((iVar5 != 0) && (puVar2 = _force_flush_local->hasher_, puVar2 != (HasherHandle)0x0))
            {
              puVar2[0x14] = '\0';
              puVar2[0x15] = '\0';
              puVar2[0x16] = '\0';
              puVar2[0x17] = '\0';
            }
            *output_local = (uint8_t *)0x0;
            s_local._4_4_ = 1;
          }
          else {
            if (_force_flush_local->last_insert_len_ != 0) {
              sVar8 = _force_flush_local->num_commands_;
              _force_flush_local->num_commands_ = sVar8 + 1;
              local_fc8 = _force_flush_local->commands_ + sVar8;
              local_fd0 = _force_flush_local->last_insert_len_;
              local_fc8->insert_len_ = (uint32_t)local_fd0;
              local_fc8->copy_len_ = 0x8000000;
              local_fc8->dist_extra_ = 0;
              local_fc8->dist_prefix_ = 0x10;
              puStack_d0 = &local_fc8->cmd_prefix_;
              local_c0 = 4;
              local_c4 = 0;
              if (local_fd0 < 6) {
                local_9e = (ushort)local_fd0;
              }
              else if (local_fd0 < 0x82) {
                local_68 = local_fd0 - 2;
                local_ac = 0x1f;
                if ((uint)local_68 != 0) {
                  for (; (uint)local_68 >> local_ac == 0; local_ac = local_ac + -1) {
                  }
                }
                local_ac = local_ac + -1;
                local_9e = (short)local_ac * 2 + (short)(local_fd0 - 2 >> ((byte)local_ac & 0x3f)) +
                           2;
              }
              else if (local_fd0 < 0x842) {
                local_60 = local_fd0 - 0x42;
                iVar5 = 0x1f;
                if ((uint)local_60 != 0) {
                  for (; (uint)local_60 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                  }
                }
                local_9e = (short)iVar5 + 10;
              }
              else if (local_fd0 < 0x1842) {
                local_9e = 0x15;
              }
              else if (local_fd0 < 0x5842) {
                local_9e = 0x16;
              }
              else {
                local_9e = 0x17;
              }
              local_d2 = local_9e;
              uStack_98 = 4;
              local_8e = 2;
              local_d4 = 2;
              local_7c = local_9e;
              bits64 = 2;
              offset_6 = 0;
              local_86 = (local_9e & 7) << 3 | 2;
              local_8c = ((int)(uint)local_9e >> 3) * 0xc0 + 0x40 +
                         (0x520d40 >> ((char)((int)(uint)local_9e >> 3) * '\x06' & 0x1fU) & 0xc0U);
              local_7a = (ushort)local_8c | local_86;
              *puStack_d0 = local_7a;
              _force_flush_local->num_literals_ =
                   _force_flush_local->last_insert_len_ + _force_flush_local->num_literals_;
              _force_flush_local->last_insert_len_ = 0;
              local_b8 = local_fd0;
              uStack_a8 = local_fd0;
            }
            if ((out_size_local._4_4_ == 0) &&
               (_force_flush_local->input_pos_ == _force_flush_local->last_flush_pos_)) {
              *output_local = (uint8_t *)0x0;
              s_local._4_4_ = 1;
            }
            else {
              storage_1._4_4_ =
                   (int)_force_flush_local->input_pos_ - (int)_force_flush_local->last_flush_pos_;
              storage_ix_1 = (size_t)GetBrotliStorage(_force_flush_local,
                                                      (ulong)(storage_1._4_4_ * 2 + 0x1f7));
              local_1150 = (ulong)_force_flush_local->last_bytes_bits_;
              *(uint8_t *)storage_ix_1 = (uint8_t)_force_flush_local->last_bytes_;
              *(uint8_t *)(storage_ix_1 + 1) = (uint8_t)(_force_flush_local->last_bytes_ >> 8);
              WriteMetaBlockInternal
                        (pMStack_10d8,puStack_10c8,(ulong)m._4_4_,
                         _force_flush_local->last_flush_pos_,(ulong)storage_1._4_4_,
                         out_size_local._4_4_,storage._4_4_,&_force_flush_local->params,
                         _force_flush_local->prev_byte_,_force_flush_local->prev_byte2_,
                         _force_flush_local->num_literals_,_force_flush_local->num_commands_,
                         _force_flush_local->commands_,_force_flush_local->saved_dist_cache_,
                         _force_flush_local->dist_cache_,&local_1150,(uint8_t *)storage_ix_1);
              _force_flush_local->last_bytes_ = (ushort)*(byte *)(storage_ix_1 + (local_1150 >> 3));
              _force_flush_local->last_bytes_bits_ = (byte)local_1150 & 7;
              _force_flush_local->last_flush_pos_ = _force_flush_local->input_pos_;
              iVar5 = UpdateLastProcessedPos(_force_flush_local);
              if ((iVar5 != 0) &&
                 (puVar2 = _force_flush_local->hasher_, puVar2 != (HasherHandle)0x0)) {
                puVar2[0x14] = '\0';
                puVar2[0x15] = '\0';
                puVar2[0x16] = '\0';
                puVar2[0x17] = '\0';
              }
              if (_force_flush_local->last_flush_pos_ != 0) {
                _force_flush_local->prev_byte_ =
                     puStack_10c8[(int)_force_flush_local->last_flush_pos_ - 1U & m._4_4_];
              }
              if (1 < _force_flush_local->last_flush_pos_) {
                _force_flush_local->prev_byte2_ =
                     puStack_10c8[(int)_force_flush_local->last_flush_pos_ - 2U & m._4_4_];
              }
              _force_flush_local->num_commands_ = 0;
              _force_flush_local->num_literals_ = 0;
              *(undefined8 *)_force_flush_local->saved_dist_cache_ =
                   *(undefined8 *)_force_flush_local->dist_cache_;
              *(undefined8 *)(_force_flush_local->saved_dist_cache_ + 2) =
                   *(undefined8 *)(_force_flush_local->dist_cache_ + 2);
              *(size_t *)delta = storage_ix_1;
              *output_local = (uint8_t *)(local_1150 >> 3);
              s_local._4_4_ = 1;
            }
          }
        }
      }
    }
    else {
      s_local._4_4_ = 0;
    }
  }
  return s_local._4_4_;
LAB_00110d62:
  local_128 = local_128 + 1;
  limit2 = limit2 + 8;
  goto LAB_00110d00;
}

Assistant:

static BROTLI_BOOL EncodeData(
    BrotliEncoderState* s, const BROTLI_BOOL is_last,
    const BROTLI_BOOL force_flush, size_t* out_size, uint8_t** output) {
  const uint64_t delta = UnprocessedInputSize(s);
  uint32_t bytes = (uint32_t)delta;
  uint32_t wrapped_last_processed_pos = WrapPosition(s->last_processed_pos_);
  uint8_t* data;
  uint32_t mask;
  MemoryManager* m = &s->memory_manager_;
  ContextType literal_context_mode;

  if (!EnsureInitialized(s)) return BROTLI_FALSE;
  data = s->ringbuffer_.buffer_;
  mask = s->ringbuffer_.mask_;

  /* Adding more blocks after "last" block is forbidden. */
  if (s->is_last_block_emitted_) return BROTLI_FALSE;
  if (is_last) s->is_last_block_emitted_ = BROTLI_TRUE;

  if (delta > InputBlockSize(s)) {
    return BROTLI_FALSE;
  }
  if (s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY &&
      !s->command_buf_) {
    s->command_buf_ =
        BROTLI_ALLOC(m, uint32_t, kCompressFragmentTwoPassBlockSize);
    s->literal_buf_ =
        BROTLI_ALLOC(m, uint8_t, kCompressFragmentTwoPassBlockSize);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  }

  if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    uint8_t* storage;
    size_t storage_ix = s->last_bytes_bits_;
    size_t table_size;
    int* table;

    if (delta == 0 && !is_last) {
      /* We have no new input data and we don't have to finish the stream, so
         nothing to do. */
      *out_size = 0;
      return BROTLI_TRUE;
    }
    storage = GetBrotliStorage(s, 2 * bytes + 503);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = (uint8_t)s->last_bytes_;
    storage[1] = (uint8_t)(s->last_bytes_ >> 8);
    table = GetHashTable(s, s->params.quality, bytes, &table_size);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY) {
      BrotliCompressFragmentFast(
          m, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          table, table_size,
          s->cmd_depths_, s->cmd_bits_,
          &s->cmd_code_numbits_, s->cmd_code_,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    } else {
      BrotliCompressFragmentTwoPass(
          m, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          s->command_buf_, s->literal_buf_,
          table, table_size,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    }
    s->last_bytes_ = (uint16_t)(storage[storage_ix >> 3]);
    s->last_bytes_bits_ = storage_ix & 7u;
    UpdateLastProcessedPos(s);
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }

  {
    /* Theoretical max number of commands is 1 per 2 bytes. */
    size_t newsize = s->num_commands_ + bytes / 2 + 1;
    if (newsize > s->cmd_alloc_size_) {
      Command* new_commands;
      /* Reserve a bit more memory to allow merging with a next block
         without reallocation: that would impact speed. */
      newsize += (bytes / 4) + 16;
      s->cmd_alloc_size_ = newsize;
      new_commands = BROTLI_ALLOC(m, Command, newsize);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
      if (s->commands_) {
        memcpy(new_commands, s->commands_, sizeof(Command) * s->num_commands_);
        BROTLI_FREE(m, s->commands_);
      }
      s->commands_ = new_commands;
    }
  }

  InitOrStitchToPreviousBlock(m, &s->hasher_, data, mask, &s->params,
      wrapped_last_processed_pos, bytes, is_last);

  literal_context_mode = ChooseContextMode(
      &s->params, data, WrapPosition(s->last_flush_pos_),
      mask, (size_t)(s->input_pos_ - s->last_flush_pos_));

  if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;

  if (s->num_commands_ && s->last_insert_len_ == 0) {
    ExtendLastCommand(s, &bytes, &wrapped_last_processed_pos);
  }

  if (s->params.quality == ZOPFLIFICATION_QUALITY) {
    BROTLI_DCHECK(s->params.hasher.type == 10);
    BrotliCreateZopfliBackwardReferences(m,
        bytes, wrapped_last_processed_pos,
        data, mask, &s->params, s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else if (s->params.quality == HQ_ZOPFLIFICATION_QUALITY) {
    BROTLI_DCHECK(s->params.hasher.type == 10);
    BrotliCreateHqZopfliBackwardReferences(m,
        bytes, wrapped_last_processed_pos,
        data, mask, &s->params, s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else {
    BrotliCreateBackwardReferences(
        bytes, wrapped_last_processed_pos,
        data, mask, &s->params, s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
  }

  {
    const size_t max_length = MaxMetablockSize(&s->params);
    const size_t max_literals = max_length / 8;
    const size_t max_commands = max_length / 8;
    const size_t processed_bytes = (size_t)(s->input_pos_ - s->last_flush_pos_);
    /* If maximal possible additional block doesn't fit metablock, flush now. */
    /* TODO: Postpone decision until next block arrives? */
    const BROTLI_BOOL next_input_fits_metablock = TO_BROTLI_BOOL(
        processed_bytes + InputBlockSize(s) <= max_length);
    /* If block splitting is not used, then flush as soon as there is some
       amount of commands / literals produced. */
    const BROTLI_BOOL should_flush = TO_BROTLI_BOOL(
        s->params.quality < MIN_QUALITY_FOR_BLOCK_SPLIT &&
        s->num_literals_ + s->num_commands_ >= MAX_NUM_DELAYED_SYMBOLS);
    if (!is_last && !force_flush && !should_flush &&
        next_input_fits_metablock &&
        s->num_literals_ < max_literals &&
        s->num_commands_ < max_commands) {
      /* Merge with next input block. Everything will happen later. */
      if (UpdateLastProcessedPos(s)) {
        HasherReset(s->hasher_);
      }
      *out_size = 0;
      return BROTLI_TRUE;
    }
  }

  /* Create the last insert-only command. */
  if (s->last_insert_len_ > 0) {
    InitInsertCommand(&s->commands_[s->num_commands_++], s->last_insert_len_);
    s->num_literals_ += s->last_insert_len_;
    s->last_insert_len_ = 0;
  }

  if (!is_last && s->input_pos_ == s->last_flush_pos_) {
    /* We have no new input data and we don't have to finish the stream, so
       nothing to do. */
    *out_size = 0;
    return BROTLI_TRUE;
  }
  BROTLI_DCHECK(s->input_pos_ >= s->last_flush_pos_);
  BROTLI_DCHECK(s->input_pos_ > s->last_flush_pos_ || is_last);
  BROTLI_DCHECK(s->input_pos_ - s->last_flush_pos_ <= 1u << 24);
  {
    const uint32_t metablock_size =
        (uint32_t)(s->input_pos_ - s->last_flush_pos_);
    uint8_t* storage = GetBrotliStorage(s, 2 * metablock_size + 503);
    size_t storage_ix = s->last_bytes_bits_;
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = (uint8_t)s->last_bytes_;
    storage[1] = (uint8_t)(s->last_bytes_ >> 8);
    WriteMetaBlockInternal(
        m, data, mask, s->last_flush_pos_, metablock_size, is_last,
        literal_context_mode, &s->params, s->prev_byte_, s->prev_byte2_,
        s->num_literals_, s->num_commands_, s->commands_, s->saved_dist_cache_,
        s->dist_cache_, &storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    s->last_bytes_ = (uint16_t)(storage[storage_ix >> 3]);
    s->last_bytes_bits_ = storage_ix & 7u;
    s->last_flush_pos_ = s->input_pos_;
    if (UpdateLastProcessedPos(s)) {
      HasherReset(s->hasher_);
    }
    if (s->last_flush_pos_ > 0) {
      s->prev_byte_ = data[((uint32_t)s->last_flush_pos_ - 1) & mask];
    }
    if (s->last_flush_pos_ > 1) {
      s->prev_byte2_ = data[(uint32_t)(s->last_flush_pos_ - 2) & mask];
    }
    s->num_commands_ = 0;
    s->num_literals_ = 0;
    /* Save the state of the distance cache in case we need to restore it for
       emitting an uncompressed block. */
    memcpy(s->saved_dist_cache_, s->dist_cache_, sizeof(s->saved_dist_cache_));
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }
}